

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void * mwMalloc(size_t size,char *file,int line)

{
  size_t __size;
  size_t sVar1;
  long lVar2;
  void *p;
  char *ptr;
  mwData *mw;
  size_t needed;
  int line_local;
  char *file_local;
  size_t size_local;
  
  mwAutoInit();
  if (mwTestAlways != 0) {
    mwTestNow(file,line,1);
  }
  mwCounter = mwCounter + 1;
  __size = (long)(mwDataSize + mwOverflowZoneSize * 2) + size;
  if (__size < size) {
    size_local = 0;
  }
  else if ((mwUseLimit == 0) || ((long)(size + mwStatCurAlloc) <= mwAllocLimit)) {
    ptr = (char *)malloc(__size);
    if (ptr == (char *)0x0) {
      sVar1 = mwFreeUp(__size,0);
      if ((__size <= sVar1) && (ptr = (char *)malloc(__size), ptr == (char *)0x0)) {
        mwWrite("internal: mwFreeUp(%u) reported success, but malloc() fails\n",__size);
        mwIncErr();
        mwFlush();
      }
      if (ptr == (char *)0x0) {
        mwWrite("fail: <%ld> %s(%d), %ld wanted %ld allocated\n",mwCounter,file,(ulong)(uint)line,
                size,mwStatCurAlloc);
        mwIncErr();
        mwFlush();
        return (void *)0x0;
      }
    }
    *(unsigned_long *)(ptr + 0x18) = mwCounter;
    ptr[0] = '\0';
    ptr[1] = '\0';
    ptr[2] = '\0';
    ptr[3] = '\0';
    ptr[4] = '\0';
    ptr[5] = '\0';
    ptr[6] = '\0';
    ptr[7] = '\0';
    *(mwData **)(ptr + 8) = mwHead;
    *(char **)(ptr + 0x10) = file;
    *(size_t *)(ptr + 0x28) = size;
    *(int *)(ptr + 0x30) = line;
    ptr[0x34] = '\0';
    ptr[0x35] = '\0';
    ptr[0x36] = '\0';
    ptr[0x37] = '\0';
    *(ulong *)(ptr + 0x20) =
         *(ulong *)(ptr + 0x18) ^ 0xfe0180 ^ *(ulong *)(ptr + 0x28) ^ (long)*(int *)(ptr + 0x30);
    if (mwHead != (mwData *)0x0) {
      mwHead->prev = (mwData *)ptr;
    }
    mwHead = (mwData *)ptr;
    if (mwTail == (mwData *)0x0) {
      mwTail = (mwData *)ptr;
    }
    lVar2 = (long)mwDataSize;
    mwWriteOF(ptr + lVar2);
    size_local = (size_t)(ptr + lVar2 + mwOverflowZoneSize);
    memset((void *)size_local,0xfe,size);
    mwWriteOF((char *)(size_local + size));
    mwNumCurAlloc = mwNumCurAlloc + 1;
    mwStatCurAlloc = size + mwStatCurAlloc;
    mwStatTotAlloc = size + mwStatTotAlloc;
    if (mwStatMaxAlloc < mwStatCurAlloc) {
      mwStatMaxAlloc = mwStatCurAlloc;
    }
    mwStatNumAlloc = mwStatNumAlloc + 1;
    if (mwStatLevel != 0) {
      mwStatAlloc(size,file,line);
    }
  }
  else {
    mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",mwCounter,file,(ulong)(uint)line,
            size,mwAllocLimit - mwStatCurAlloc);
    mwIncErr();
    mwFlush();
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

void *mwMalloc(size_t size, const char *file, int line)
{
	size_t needed;
	mwData *mw;
	char *ptr;
	void *p;

	mwAutoInit();

	MW_MUTEX_LOCK();

	TESTS(file, line);

	mwCounter ++;
	needed = mwDataSize + mwOverflowZoneSize * 2 + size;
	if (needed < size) {
		/* theoretical case: req size + mw overhead exceeded size_t limits */
		return NULL;
	}

	/* if this allocation would violate the limit, fail it */
	if (mwUseLimit && ((long)size + mwStatCurAlloc > mwAllocLimit)) {
		mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",
				mwCounter, file, line, (long)size, mwAllocLimit - mwStatCurAlloc);
		mwIncErr();
		FLUSH();
		MW_MUTEX_UNLOCK();
		return NULL;
	}

	mw = (mwData *) malloc(needed);
	if (mw == NULL) {
		if (mwFreeUp(needed, 0) >= needed) {
			mw = (mwData *) malloc(needed);
			if (mw == NULL) {
				mwWrite("internal: mwFreeUp(%u) reported success, but malloc() fails\n", needed);
				mwIncErr();
				FLUSH();
			}
		}
		if (mw == NULL) {
			mwWrite("fail: <%ld> %s(%d), %ld wanted %ld allocated\n",
					mwCounter, file, line, (long)size, mwStatCurAlloc);
			mwIncErr();
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}
	}

	mw->count = mwCounter;
	mw->prev = NULL;
	mw->next = mwHead;
	mw->file = file;
	mw->size = size;
	mw->line = line;
	mw->flag = 0;
	mw->check = CHKVAL(mw);

	if (mwHead) {
		mwHead->prev = mw;
	}
	mwHead = mw;
	if (mwTail == NULL) {
		mwTail = mw;
	}

	ptr = ((char *)mw) + mwDataSize;
	mwWriteOF(ptr);   /* '*(long*)ptr = PRECHK;' */
	ptr += mwOverflowZoneSize;
	p = ptr;
	memset(ptr, MW_VAL_NEW, size);
	ptr += size;
	mwWriteOF(ptr);   /* '*(long*)ptr = POSTCHK;' */

	mwNumCurAlloc ++;
	mwStatCurAlloc += (long) size;
	mwStatTotAlloc += (long) size;
	if (mwStatCurAlloc > mwStatMaxAlloc) {
		mwStatMaxAlloc = mwStatCurAlloc;
	}
	mwStatNumAlloc ++;

	if (mwStatLevel) {
		mwStatAlloc(size, file, line);
	}

	MW_MUTEX_UNLOCK();
	return p;
}